

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DODNTSCD.h
# Opt level: O1

void __thiscall
dg::DODNTSCD::
computeNTSCD<std::map<dg::CDNode*,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&,std::less<dg::CDNode*>,std::allocator<std::pair<dg::CDNode*const,dg::ADT::SparseBitvectorImpl<unsigned_long,unsigned_long,unsigned_long,1ul,dg::MapImpl<unsigned_long,unsigned_long,std::map<unsigned_long,unsigned_long,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>const&>>>>
          (DODNTSCD *this,CDNode *p,CDGraph *graph,
          map<dg::CDNode_*,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_const_dg::ADT::SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_&>_>_>
          *onallpaths,ResultT *CD,ResultT *revCD)

{
  pointer ppCVar1;
  CDNode *pCVar2;
  pointer puVar3;
  bool bVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
  *p_Var7;
  _Rb_tree_header *p_Var8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  pointer puVar11;
  ContainedType *n;
  _Head_base<0UL,_dg::CDNode_*,_false> local_50;
  ResultT *local_48;
  ResultT *local_40;
  CDNode *local_38;
  
  ppCVar1 = (p->super_ElemWithEdges<dg::CDNode>)._successors.
            super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pCVar2 = *ppCVar1;
  p_Var8 = &(onallpaths->_M_t)._M_impl.super__Rb_tree_header;
  p_Var6 = (onallpaths->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var9 = p_Var6;
  p_Var10 = &p_Var8->_M_header;
  for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[*(CDNode **)(p_Var9 + 1) < pCVar2]) {
    if (*(CDNode **)(p_Var9 + 1) >= pCVar2) {
      p_Var10 = p_Var9;
    }
  }
  p_Var9 = &p_Var8->_M_header;
  if (((_Rb_tree_header *)p_Var10 != p_Var8) &&
     (p_Var9 = p_Var10, pCVar2 < *(CDNode **)(p_Var10 + 1))) {
    p_Var9 = &p_Var8->_M_header;
  }
  if ((_Rb_tree_header *)p_Var9 != p_Var8) {
    pCVar2 = ppCVar1[1];
    p_Var10 = &p_Var8->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(CDNode **)(p_Var6 + 1) < pCVar2])
    {
      if (*(CDNode **)(p_Var6 + 1) >= pCVar2) {
        p_Var10 = p_Var6;
      }
    }
    p_Var6 = &p_Var8->_M_header;
    if (((_Rb_tree_header *)p_Var10 != p_Var8) &&
       (p_Var6 = p_Var10, pCVar2 < *(CDNode **)(p_Var10 + 1))) {
      p_Var6 = &p_Var8->_M_header;
    }
    if ((_Rb_tree_header *)p_Var6 != p_Var8) {
      puVar11 = (graph->_nodes).
                super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar3 = (graph->_nodes).
               super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar11 != puVar3) {
        p_Var9 = p_Var9[1]._M_parent;
        p_Var6 = p_Var6[1]._M_parent;
        local_48 = CD;
        local_40 = revCD;
        local_38 = p;
        do {
          local_50._M_head_impl =
               (puVar11->_M_t).super___uniq_ptr_impl<dg::CDNode,_std::default_delete<dg::CDNode>_>.
               _M_t.super__Tuple_impl<0UL,_dg::CDNode_*,_std::default_delete<dg::CDNode>_>.
               super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl;
          bVar4 = ADT::
                  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                  ::get((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                         *)p_Var9,(ulong)(local_50._M_head_impl)->_id);
          bVar5 = ADT::
                  SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                  ::get((SparseBitvectorImpl<unsigned_long,_unsigned_long,_unsigned_long,_1UL,_dg::MapImpl<unsigned_long,_unsigned_long,_std::map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                         *)p_Var6,(ulong)(local_50._M_head_impl)->_id);
          if (bVar4 != bVar5) {
            p_Var7 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                      *)std::
                        map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                        ::operator[](local_48,&local_50._M_head_impl);
            std::
            _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
            ::_M_insert_unique<dg::CDNode*const&>(p_Var7,&local_38);
            p_Var7 = (_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                      *)std::
                        map<dg::CDNode_*,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>,_std::less<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_std::set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>_>_>_>
                        ::operator[](local_40,&local_38);
            std::
            _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
            ::_M_insert_unique<dg::CDNode*const&>(p_Var7,&local_50._M_head_impl);
          }
          puVar11 = puVar11 + 1;
        } while (puVar11 != puVar3);
      }
    }
  }
  return;
}

Assistant:

void computeNTSCD(CDNode *p, CDGraph &graph, const OnAllPathsT &onallpaths,
                      ResultT &CD, ResultT &revCD) {
        const auto &succs = p->successors();
        assert(succs.size() == 2);
        auto succit = succs.begin();
        auto *s1 = *succit;
        auto *s2 = *(++succit);
        assert(++succit == succs.end());

        auto it1 = onallpaths.find(s1);
        if (it1 == onallpaths.end())
            return;
        auto it2 = onallpaths.find(s2);
        if (it2 == onallpaths.end())
            return;

        const auto &nodes1 = it1->second;
        const auto &nodes2 = it2->second;
        // FIXME: we could do that faster
        for (auto *n : graph) {
            if (nodes1.get(n->getID()) ^ nodes2.get(n->getID())) {
                CD[n].insert(p);
                revCD[p].insert(n);
            }
        }
    }